

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O1

char * passphrase_callback(archive *a,void *_client_data)

{
  char *pcVar1;
  int *piVar2;
  
  if (passphrase_buf == (char *)0x0) {
    passphrase_buf = (char *)malloc(0x400);
    if (passphrase_buf == (char *)0x0) {
      piVar2 = __errno_location();
      *piVar2 = 0xc;
      pcVar1 = "malloc()";
      goto LAB_00104d80;
    }
  }
  pcVar1 = lafe_readpassphrase("\nEnter password: ",passphrase_buf,0x400);
  if (pcVar1 == (char *)0x0) {
    piVar2 = __errno_location();
    if (*piVar2 != 4) {
      pcVar1 = "Error reading password";
LAB_00104d80:
      error(pcVar1);
    }
  }
  return pcVar1;
}

Assistant:

static const char *
passphrase_callback(struct archive *a, void *_client_data)
{
	char *p;

	(void)a; /* UNUSED */
	(void)_client_data; /* UNUSED */

	if (passphrase_buf == NULL) {
		passphrase_buf = malloc(PPBUFF_SIZE);
		if (passphrase_buf == NULL) {
			errno = ENOMEM;
			error("malloc()");
		}
	}

	p = lafe_readpassphrase("\nEnter password: ", passphrase_buf,
		PPBUFF_SIZE);

	if (p == NULL && errno != EINTR)
		error("Error reading password");

	return p;
}